

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O0

void __thiscall random_tests::shuffle_stat_test::test_method(shuffle_stat_test *this)

{
  uint32_t uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  FastRandomContext *in_stack_ffffffffffffcab8;
  lazy_ostream *in_stack_ffffffffffffcac0;
  char *in_stack_ffffffffffffcac8;
  lazy_ostream *in_stack_ffffffffffffcae0;
  size_t in_stack_ffffffffffffcae8;
  size_t line_num;
  undefined7 in_stack_ffffffffffffcaf0;
  undefined1 in_stack_ffffffffffffcaf7;
  lazy_ostream *in_stack_ffffffffffffcaf8;
  FastRandomContext *in_stack_ffffffffffffcb18;
  undefined7 in_stack_ffffffffffffcb20;
  undefined1 in_stack_ffffffffffffcb27;
  int *in_stack_ffffffffffffcb28;
  uint32_t count;
  int i5;
  int i4;
  int i3;
  int i2;
  int i1;
  int i_1;
  double chi_score;
  int pos;
  int i;
  shuffle_stat_test *this_local;
  undefined4 local_343c;
  const_string local_33e8 [2];
  lazy_ostream local_33c8;
  assertion_result local_33a8 [2];
  const_string local_3370 [2];
  lazy_ostream local_3350 [2];
  assertion_result local_3330 [2];
  const_string local_32f8 [2];
  lazy_ostream local_32d8 [2];
  assertion_result local_32b8 [2];
  const_string local_3280 [2];
  lazy_ostream local_3260 [2];
  assertion_result local_3240 [2];
  const_string local_3208 [2];
  lazy_ostream local_31e8 [2];
  assertion_result local_31c8 [2];
  uint sum;
  int data [5];
  uint32_t counts [3125];
  FastRandomContext ctx;
  
  counts[0x85a] = 0;
  counts[0x85b] = 0;
  counts[0x45a] = 0;
  counts[0x45b] = 0;
  counts[0x5a] = 0;
  counts[0x5b] = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_ffffffffffffcac8,
             SUB81((ulong)in_stack_ffffffffffffcac0 >> 0x38,0));
  memset(counts,0,0x30d4);
  for (i = 0; i < 12000; i = i + 1) {
    data[0] = 0;
    data[1] = 1;
    data[2] = 2;
    data[3] = 3;
    data[4] = 4;
    std::begin<int,5ul>((int (*) [5])in_stack_ffffffffffffcab8);
    std::end<int,5ul>((int (*) [5])in_stack_ffffffffffffcab8);
    std::shuffle<int*,FastRandomContext&>
              (in_stack_ffffffffffffcb28,
               (int *)CONCAT17(in_stack_ffffffffffffcb27,in_stack_ffffffffffffcb20),
               in_stack_ffffffffffffcb18);
    iVar4 = data[0] + data[1] * 5 + data[2] * 0x19 + data[3] * 0x7d + data[4] * 0x271;
    counts[iVar4] = counts[iVar4] + 1;
  }
  sum = 0;
  for (i_1 = 0; i_1 < 0xc35; i_1 = i_1 + 1) {
    iVar5 = i_1 % 5;
    iVar6 = (int)((long)((ulong)(uint)((int)((long)i_1 / 5) >> 0x1f) << 0x20 |
                        (long)i_1 / 5 & 0xffffffffU) % 5);
    iVar7 = (int)((long)((ulong)(uint)((int)((long)i_1 / 0x19) >> 0x1f) << 0x20 |
                        (long)i_1 / 0x19 & 0xffffffffU) % 5);
    iVar8 = (int)((long)((ulong)(uint)((int)((long)i_1 / 0x7d) >> 0x1f) << 0x20 |
                        (long)i_1 / 0x7d & 0xffffffffU) % 5);
    iVar4 = i_1 / 0x271;
    uVar1 = counts[i_1];
    if ((((((iVar5 == iVar6) || (iVar5 == iVar7)) || (iVar5 == iVar8)) ||
         ((iVar5 == iVar4 || (iVar6 == iVar7)))) ||
        ((iVar6 == iVar8 || ((iVar6 == iVar4 || (iVar7 == iVar8)))))) ||
       ((iVar7 == iVar4 || (iVar8 == iVar4)))) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffcaf8,
                   (const_string *)CONCAT17(in_stack_ffffffffffffcaf7,in_stack_ffffffffffffcaf0),
                   in_stack_ffffffffffffcae8,(const_string *)in_stack_ffffffffffffcae0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffcac8,
                   SUB81((ulong)in_stack_ffffffffffffcac0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffcac0,(basic_cstring<const_char> *)in_stack_ffffffffffffcab8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        in_stack_ffffffffffffcab8 = (FastRandomContext *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_31c8,local_31e8,local_3208,0xe5,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffcab8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffcab8);
        bVar3 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar3);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffcaf8,
                   (const_string *)CONCAT17(in_stack_ffffffffffffcaf7,in_stack_ffffffffffffcaf0),
                   in_stack_ffffffffffffcae8,(const_string *)in_stack_ffffffffffffcae0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffcac8,
                   SUB81((ulong)in_stack_ffffffffffffcac0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffcac0,(basic_cstring<const_char> *)in_stack_ffffffffffffcab8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        in_stack_ffffffffffffcab8 = (FastRandomContext *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_3240,local_3260,local_3280,0xe8,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffcab8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffcab8);
        bVar3 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar3);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffcaf8,
                   (const_string *)CONCAT17(in_stack_ffffffffffffcaf7,in_stack_ffffffffffffcaf0),
                   in_stack_ffffffffffffcae8,(const_string *)in_stack_ffffffffffffcae0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffcac8,
                   SUB81((ulong)in_stack_ffffffffffffcac0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffcac0,(basic_cstring<const_char> *)in_stack_ffffffffffffcab8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
                   (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
        in_stack_ffffffffffffcab8 = (FastRandomContext *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_32b8,local_32d8,local_32f8,0xe9,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffcab8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffcab8);
        bVar3 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar3);
      sum = uVar1 + sum;
    }
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffcaf7,in_stack_ffffffffffffcaf0),
               in_stack_ffffffffffffcae8,(const_string *)in_stack_ffffffffffffcae0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcac8,
               SUB81((ulong)in_stack_ffffffffffffcac0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffcac0,(basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    in_stack_ffffffffffffcab8 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3330,local_3350,local_3370,0xed,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffcab8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffcab8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffcaf7,in_stack_ffffffffffffcaf0),
               in_stack_ffffffffffffcae8,(const_string *)in_stack_ffffffffffffcae0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcac8,
               SUB81((ulong)in_stack_ffffffffffffcac0 >> 0x38,0));
    in_stack_ffffffffffffcaf8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffcac0,(basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    in_stack_ffffffffffffcab8 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_33a8,&local_33c8,local_33e8,0xee,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffcab8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffcab8);
    in_stack_ffffffffffffcaf7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffcaf7);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcab8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffcaf7,in_stack_ffffffffffffcaf0),
               line_num,(const_string *)in_stack_ffffffffffffcae0);
    in_stack_ffffffffffffcae0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffcac0,(char (*) [1])in_stack_ffffffffffffcab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcac8,
               (pointer)in_stack_ffffffffffffcac0,(unsigned_long)in_stack_ffffffffffffcab8);
    local_343c = 12000;
    in_stack_ffffffffffffcac8 = "12000U";
    in_stack_ffffffffffffcac0 = (lazy_ostream *)&local_343c;
    in_stack_ffffffffffffcab8 = (FastRandomContext *)0x1bf2c5f;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&stack0xffffffffffffcbd8,&stack0xffffffffffffcbc8,0xef,1,2,&sum);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcab8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffcab8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(shuffle_stat_test)
{
    FastRandomContext ctx(true);
    uint32_t counts[5 * 5 * 5 * 5 * 5] = {0};
    for (int i = 0; i < 12000; ++i) {
        int data[5] = {0, 1, 2, 3, 4};
        std::shuffle(std::begin(data), std::end(data), ctx);
        int pos = data[0] + data[1] * 5 + data[2] * 25 + data[3] * 125 + data[4] * 625;
        ++counts[pos];
    }
    unsigned int sum = 0;
    double chi_score = 0.0;
    for (int i = 0; i < 5 * 5 * 5 * 5 * 5; ++i) {
        int i1 = i % 5, i2 = (i / 5) % 5, i3 = (i / 25) % 5, i4 = (i / 125) % 5, i5 = i / 625;
        uint32_t count = counts[i];
        if (i1 == i2 || i1 == i3 || i1 == i4 || i1 == i5 || i2 == i3 || i2 == i4 || i2 == i5 || i3 == i4 || i3 == i5 || i4 == i5) {
            BOOST_CHECK(count == 0);
        } else {
            chi_score += ((count - 100.0) * (count - 100.0)) / 100.0;
            BOOST_CHECK(count > 50);
            BOOST_CHECK(count < 150);
            sum += count;
        }
    }
    BOOST_CHECK(chi_score > 58.1411); // 99.9999% confidence interval
    BOOST_CHECK(chi_score < 210.275);
    BOOST_CHECK_EQUAL(sum, 12000U);
}